

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

void __thiscall jbcoin::STObject::makeFieldAbsent(STObject *this,SField *field)

{
  int iVar1;
  SField *pSVar2;
  reference this_00;
  STVar local_88;
  STBase *local_28;
  STBase *f;
  SField *pSStack_18;
  int index;
  SField *field_local;
  STObject *this_local;
  
  pSStack_18 = field;
  field_local = (SField *)this;
  f._4_4_ = getFieldIndex(this,field);
  if (f._4_4_ != -1) {
    local_28 = peekAtIndex(this,f._4_4_);
    iVar1 = (*local_28->_vptr_STBase[4])();
    if (iVar1 != 0) {
      pSVar2 = STBase::getFName(local_28);
      jbcoin::detail::STVar::STVar(&local_88,pSVar2);
      this_00 = std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::
                operator[](&this->v_,(long)f._4_4_);
      jbcoin::detail::STVar::operator=(this_00,&local_88);
      jbcoin::detail::STVar::~STVar(&local_88);
    }
    return;
  }
  Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
}

Assistant:

void STObject::makeFieldAbsent (SField const& field)
{
    int index = getFieldIndex (field);

    if (index == -1)
        Throw<std::runtime_error> ("Field not found");

    const STBase& f = peekAtIndex (index);

    if (f.getSType () == STI_NOTPRESENT)
        return;
    v_[index] = detail::STVar(
        detail::nonPresentObject, f.getFName());
}